

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O3

bool __thiscall
GmmLib::GmmResourceInfoCommon::IsMipRCCAligned(GmmResourceInfoCommon *this,uint8_t *MisAlignedLod)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  
  (*this->_vptr_GmmResourceInfoCommon[0x2a])();
  uVar3 = 0;
  bVar2 = 0;
  while ((uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x16])(this,uVar3), (uVar1 & 0x1f) == 0 &&
         (uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x17])(this,uVar3), (uVar1 & 3) == 0))) {
    bVar2 = bVar2 + 1;
    uVar3 = (ulong)bVar2;
    uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x2a])(this);
    if ((uVar1 & 0xff) < (uint)bVar2) {
      return true;
    }
  }
  *MisAlignedLod = bVar2;
  return false;
}

Assistant:

bool GMM_STDCALL GmmLib::GmmResourceInfoCommon::IsMipRCCAligned(uint8_t &MisAlignedLod)
{
    const uint8_t RCCCachelineWidth  = 32;
    const uint8_t RCCCachelineHeight = 4;

    for(uint8_t lod = 0; lod <= ((uint8_t)GetMaxLod()); lod++)
    {
        if(!(GFX_IS_ALIGNED(GetMipWidth(lod), RCCCachelineWidth) &&
             GFX_IS_ALIGNED(GetMipHeight(lod), RCCCachelineHeight)))
        {
            MisAlignedLod = lod;
            return false;
        }
    }
    return true;
}